

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

void __thiscall libcellml::Importer::~Importer(Importer *this)

{
  pointer puVar1;
  LoggerImpl *pLVar2;
  
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__Importer_002f5dc8;
  (this->super_Strict)._vptr_Strict = (_func_int **)&PTR__Importer_002f5de8;
  pLVar2 = Logger::pFunc(&this->super_Logger);
  if (pLVar2 != (LoggerImpl *)0x0) {
    std::
    vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
               *)&pLVar2[1].mMessages.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
                 *)&pLVar2[1].mErrors.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish);
    std::
    vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>::
    ~vector(&pLVar2->mIssues);
    puVar1 = (pLVar2->mMessages).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)(pLVar2->mMessages).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1
                     );
    }
    puVar1 = (pLVar2->mWarnings).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)(pLVar2->mWarnings).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1
                     );
    }
    puVar1 = (pLVar2->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)(pLVar2->mErrors).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1
                     );
    }
    operator_delete(pLVar2,0xb0);
  }
  Strict::~Strict(&this->super_Strict);
  Logger::~Logger(&this->super_Logger);
  return;
}

Assistant:

Importer::~Importer()
{
    delete pFunc();
}